

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 *puVar12;
  ActualDstType actualDst;
  non_const_type *alpha;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double mass_phi2;
  double mass_phi1;
  ChMatrix33<double> RotsectB;
  ChMatrix33<double> RotsectA;
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmyy2;
  double Jmzz2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmyy1;
  double Jmzz1;
  ChMatrixNM<double,_6,_6> Tm2;
  ChMatrixNM<double,_6,_6> Tm1;
  ChMatrixNM<double,_12,_12> Tm;
  ChMatrixNM<double,_12,_12> Rotsect;
  type tmp;
  undefined8 auStack_129e [9];
  undefined8 auStack_1250 [9];
  undefined8 uStack_1208;
  undefined1 *local_1200;
  double local_11e0;
  double local_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [8];
  undefined1 local_11b8 [8];
  undefined1 local_11b0 [8];
  undefined8 local_11a8;
  undefined8 local_11a0;
  double local_1198;
  undefined8 local_1190;
  double local_1188;
  double local_1180;
  undefined8 local_1178;
  double local_1170;
  double local_1168 [6];
  double local_1138;
  undefined8 local_1130;
  double local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10d8 [8];
  undefined1 local_10d0 [8];
  undefined1 local_10c8 [8];
  double local_10c0;
  double local_10b8;
  undefined1 local_10b0 [8];
  undefined1 local_10a8 [8];
  undefined1 local_10a0 [8];
  double local_1098;
  double local_1090;
  Scalar local_1088;
  undefined1 local_1080 [16];
  double dStack_1070;
  double dStack_1068;
  undefined8 uStack_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  undefined1 auStack_1040 [16];
  double dStack_1030;
  double dStack_1028;
  double dStack_1020;
  double dStack_1018;
  double dStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [16];
  double dStack_ff0;
  double dStack_fe8;
  double dStack_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double local_fb0;
  double dStack_fa8;
  double local_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  double dStack_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  non_const_type local_f40;
  RhsNested pMStack_f38;
  double dStack_f30;
  double dStack_f28;
  double dStack_f20;
  double dStack_f18;
  double dStack_f10;
  double dStack_f08;
  double local_f00;
  double dStack_ef8;
  double dStack_ef0;
  double dStack_ee8;
  double dStack_ee0;
  double dStack_ed8;
  double dStack_ed0;
  double dStack_ec8;
  double dStack_ec0;
  double dStack_eb8;
  double dStack_eb0;
  double dStack_ea8;
  double dStack_ea0;
  double dStack_e98;
  double dStack_e90;
  double dStack_e88;
  double local_e80;
  double dStack_e78;
  double local_e70;
  double dStack_e68;
  double dStack_e60;
  double dStack_e58;
  double dStack_e50;
  double dStack_e48;
  double dStack_e40;
  double dStack_e38;
  double dStack_e30;
  double dStack_e28;
  Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_e18;
  Matrix<double,_12,_12,_1,_12,_12> *local_e08;
  Matrix<double,_12,_12,_1,_12,_12> local_e00;
  Matrix<double,_12,_12,_1,_12,_12> local_980;
  Matrix<double,_12,_12,_1,_12,_12> local_500;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar13 = 0;
  uStack_1208 = 0x60c596;
  memset(M,0,0x480);
  uStack_1208 = 0x60c5a1;
  local_11d0 = (double)(**(code **)((long)(((this->sectionA).
                                            super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                          super_ChBeamSectionEulerAdvancedGeneric.
                                          super_ChBeamSectionEuler.super_ChBeamSection.
                                          _vptr_ChBeamSection + 0x58))();
  peVar5 = (this->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_1100 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_10f8 = 0;
  local_1120 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_1118 = 0;
  local_1200 = local_10b0;
  uStack_1208 = 0x60c60e;
  (**(code **)((long)(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar5,&local_1098,&local_1090,local_10a0,local_11b8,local_10a8);
  local_11d8 = local_1098 + local_1090;
  uStack_1208 = 0x60c62a;
  local_11e0 = (double)(**(code **)((long)(((this->sectionB).
                                            super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                          super_ChBeamSectionEulerAdvancedGeneric.
                                          super_ChBeamSectionEuler.super_ChBeamSection.
                                          _vptr_ChBeamSection + 0x58))();
  peVar5 = (this->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_10f0 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_10e8 = 0;
  local_1110 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_1108 = 0;
  local_1200 = local_10d8;
  uStack_1208 = 0x60c697;
  (**(code **)((long)(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar5,&local_10c0,&local_10b8,local_10c8,local_11c0,local_10d0);
  dVar23 = this->length;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar23;
  dVar7 = dVar23 * dVar23;
  peVar6 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar2 = peVar6->phimy;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar2;
  dVar3 = peVar6->phimz;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar3;
  dVar8 = dVar2 * dVar2;
  dVar9 = dVar3 * dVar3;
  dVar10 = (0.0 / dVar23) * (0.0 / dVar23);
  dVar11 = (dVar2 + 1.0) * (dVar2 + 1.0);
  dVar3 = (dVar3 + 1.0) * (dVar3 + 1.0);
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar48,ZEXT816(0x3fd7c57c57c57c58));
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar8;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar49,ZEXT816(0x3fd5555555555555));
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar10;
  auVar14 = vfmadd231sd_fma(auVar14,auVar42,ZEXT816(0x3ff3333333333333));
  dVar31 = auVar14._0_8_ / dVar11;
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar35,ZEXT816(0x3fd7c57c57c57c58));
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar9;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar37,ZEXT816(0x3fd5555555555555));
  auVar14 = vfmadd231sd_fma(auVar14,auVar42,ZEXT816(0x3ff3333333333333));
  dVar32 = auVar14._0_8_ / dVar3;
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar48,ZEXT816(0x3fc0750750750750));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar49,ZEXT816(0x3fc5555555555555));
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar10;
  auVar21 = vfmadd231sd_fma(auVar14,auVar43,ZEXT816(0xbff3333333333333));
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar35,ZEXT816(0x3fc0750750750750));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar37,ZEXT816(0x3fc5555555555555));
  auVar22 = vfmadd231sd_fma(auVar14,auVar43,ZEXT816(0xbff3333333333333));
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fb7777777777777),auVar48,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar8;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar50,ZEXT816(0x3fa5555555555555));
  auVar15 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar48,ZEXT816(0x3fb999999999999a));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar15,auVar43);
  dVar33 = (dVar23 * auVar14._0_8_) / dVar11;
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3fb7777777777777),auVar35,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar9;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar38,ZEXT816(0x3fa5555555555555));
  auVar16 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar35,ZEXT816(0x3fb999999999999a));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar16,auVar43);
  auVar14 = vmulsd_avx512f(auVar30,auVar14);
  dVar41 = auVar14._0_8_ / dVar3;
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar48,ZEXT816(0x3f9fb1fb1fb1fb20));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar50,ZEXT816(0x3fa5555555555555));
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar10;
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar44,auVar15);
  auVar14 = vmulsd_avx512f(auVar30,auVar14);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar11;
  auVar15 = vdivsd_avx512f(auVar14,auVar52);
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar35,ZEXT816(0x3f9fb1fb1fb1fb20));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar38,ZEXT816(0x3fa5555555555555));
  auVar14 = vfnmadd231sd_avx512f(auVar14,auVar44,auVar16);
  auVar14 = vmulsd_avx512f(auVar30,auVar14);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar3;
  auVar16 = vdivsd_avx512f(auVar14,auVar47);
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar48,ZEXT816(0x3f83813813813814));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar50,ZEXT816(0x3f81111111111111));
  auVar20 = ZEXT816(0x3fc5555555555555);
  auVar17 = vfmadd213sd_avx512f(auVar20,auVar48,ZEXT816(0x3fc1111111111111));
  auVar17 = vfmadd231sd_avx512f(auVar17,auVar50,ZEXT816(0x3fd5555555555555));
  auVar14 = vfmadd213sd_avx512f(auVar17,auVar44,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7;
  auVar14 = vmulsd_avx512f(auVar19,auVar14);
  auVar17 = vdivsd_avx512f(auVar14,auVar52);
  auVar14 = vfmadd231sd_avx512f(ZEXT816(0x3f83813813813814),auVar35,ZEXT816(0x3f91111111111111));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar38,ZEXT816(0x3f81111111111111));
  auVar18 = vfmadd231sd_avx512f(ZEXT816(0x3fc1111111111111),auVar35,auVar20);
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar38,ZEXT816(0x3fd5555555555555));
  auVar14 = vfmadd213sd_avx512f(auVar18,auVar44,auVar14);
  auVar14 = vmulsd_avx512f(auVar19,auVar14);
  auVar18 = vdivsd_avx512f(auVar14,auVar47);
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar48,ZEXT816(0x3f7d41d41d41d41d));
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar8;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar51,ZEXT816(0x3f81111111111111));
  auVar19 = vfmadd213sd_avx512f(auVar48,auVar20,ZEXT816(0x3fa1111111111111));
  auVar19 = vfmadd231sd_avx512f(auVar19,ZEXT816(0xbfc5555555555555),auVar51);
  auVar19 = vfmadd213sd_avx512f(auVar19,auVar44,auVar14);
  auVar14 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar35,ZEXT816(0x3f7d41d41d41d41d));
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar9;
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar39,ZEXT816(0x3f81111111111111));
  auVar20 = vfmadd213sd_avx512f(auVar20,auVar35,ZEXT816(0x3fa1111111111111));
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar39,ZEXT816(0xbfc5555555555555));
  auVar14 = vfmadd213sd_avx512f(auVar20,auVar44,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar7;
  auVar20 = vmulsd_avx512f(auVar20,auVar14);
  local_11d0 = dVar23 * local_11d0;
  local_11e0 = dVar23 * local_11e0;
  dVar8 = dVar23 * peVar6->mu;
  dVar2 = peVar6->Jmxx;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_11d0 / 3.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_11e0 / 3.0;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar8;
  auVar14 = vdivsd_avx512f(auVar45,ZEXT816(0x4018000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x48;
  vmovsd_avx512f(auVar14);
  *pdVar1 = *pdVar1;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 6;
  vmovsd_avx512f(auVar14);
  *pdVar1 = *pdVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_11d8;
  auVar14 = vmulsd_avx512f(auVar30,auVar14);
  auVar14 = vdivsd_avx512f(auVar14,ZEXT816(0x4008000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x27;
  vmovsd_avx512f(auVar14);
  *pdVar1 = *pdVar1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = ((local_10c0 + local_10b8) * dVar23) / 3.0;
  dVar23 = (dVar23 * dVar2) / 6.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = local_11d0 * dVar31;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = local_11d0 * dVar32;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_11d0;
  auVar14 = vmulsd_avx512f(auVar36,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar14._0_8_;
  auVar14 = vmulsd_avx512f(auVar36,auVar18);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = auVar14._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_11e0 * dVar31;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_11e0 * dVar32;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_11e0;
  auVar14 = vmulsd_avx512f(auVar40,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar14._0_8_;
  auVar14 = vmulsd_avx512f(auVar40,auVar18);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar14._0_8_;
  dVar23 = dVar33 * -local_11d0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar23;
  dVar2 = local_11d0 * dVar41;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = dVar2;
  dVar9 = dVar8 * (auVar22._0_8_ / dVar3);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = dVar9;
  dVar10 = dVar8 * (auVar21._0_8_ / dVar11);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = dVar10;
  auVar14 = vmulsd_avx512f(auVar45,auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = auVar14._0_8_;
  auVar34._0_8_ = -dVar8;
  auVar34._8_8_ = 0x8000000000000000;
  auVar21 = vmulsd_avx512f(auVar15,auVar34);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = auVar21._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar8;
  auVar22 = vmulsd_avx512f(auVar46,auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = auVar22._0_8_;
  auVar15 = vmulsd_avx512f(auVar16,auVar34);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = auVar15._0_8_;
  dVar7 = ((auVar19._0_8_ * dVar7) / dVar11) * auVar34._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = dVar7;
  dVar3 = (auVar20._0_8_ / dVar3) * auVar34._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar3;
  dVar33 = local_11e0 * dVar33;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = dVar33;
  local_11d0 = -0.0;
  uStack_11c8 = 0x8000000000000000;
  dVar41 = dVar41 * -local_11e0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar41;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = dVar9;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = dVar10;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = auVar14._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = auVar21._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = auVar22._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = auVar15._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = dVar7;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = dVar33;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = dVar41;
  local_11e0 = (double)local_11b8;
  uStack_1208 = 0x60cb7d;
  local_11d8 = cos((double)local_11b8);
  uStack_1208 = 0x60cb8e;
  auVar28._0_8_ = sin(local_11e0);
  auVar28._8_56_ = extraout_var;
  local_1168[0] = 1.0;
  local_1168[1] = 0.0;
  local_1168[2] = -0.0;
  local_1138 = auVar28._0_8_ * 0.0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_11d8;
  dVar23 = local_11d8 * 0.0;
  local_1168[3] = local_1138 - dVar23;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_1138;
  auVar14 = vfmadd213sd_fma(ZEXT816(0),auVar21,auVar17);
  local_1168[4] = auVar14._0_8_;
  local_1138 = dVar23 + local_1138;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar23;
  auVar14 = vfmsub213sd_fma(auVar15,ZEXT816(0) << 0x40,auVar28._0_16_);
  local_1130 = auVar14._0_8_;
  local_1128 = local_11d8;
  local_11e0 = (double)local_11c0;
  uStack_1208 = 0x60cc30;
  local_1168[5] = auVar28._0_8_;
  local_11d8 = cos((double)local_11c0);
  uStack_1208 = 0x60cc41;
  auVar29._0_8_ = sin(local_11e0);
  auVar29._8_56_ = extraout_var_00;
  local_11b0 = (undefined1  [8])0x3ff0000000000000;
  local_11a8 = 0;
  local_11a0 = 0x8000000000000000;
  local_1180 = auVar29._0_8_ * 0.0;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_11d8;
  dVar23 = local_11d8 * 0.0;
  local_1198 = local_1180 - dVar23;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_1180;
  auVar14 = vfmadd213sd_fma(ZEXT816(0),auVar22,auVar18);
  local_1190 = auVar14._0_8_;
  local_1180 = dVar23 + local_1180;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar23;
  auVar14 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar16,auVar29._0_16_);
  local_1178 = auVar14._0_8_;
  local_1170 = local_11d8;
  uStack_1208 = 0x60ccc0;
  local_1188 = auVar29._0_8_;
  memset(&local_980,0,0x480);
  do {
    uVar4 = *(undefined8 *)((long)local_1168 + lVar13 + 8);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)((long)local_1168 + lVar13);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + 8) = uVar4;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + 0x10) = *(undefined8 *)((long)local_1168 + lVar13 + 0x10);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x48);
  lVar13 = 0x52;
  do {
    uVar4 = *(undefined8 *)(local_11b8 + lVar13 + 6);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -0x10) = *(undefined8 *)(local_11c0 + lVar13 + 6);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -8) = uVar4;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)(local_11b0 + lVar13 + 6);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x9a);
  lVar13 = 0xa0;
  do {
    uVar4 = *(undefined8 *)((long)auStack_1250 + lVar13 + 8);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -0x10) = *(undefined8 *)((long)auStack_1250 + lVar13);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -8) = uVar4;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)((long)auStack_1250 + lVar13 + 0x10);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0xe8);
  lVar13 = 0xee;
  do {
    uVar4 = *(undefined8 *)((long)auStack_129e + lVar13 + 8);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -0x10) = *(undefined8 *)((long)auStack_129e + lVar13);
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4 + -8) = uVar4;
    *(undefined8 *)
     ((long)local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar13 * 4) = *(undefined8 *)((long)auStack_129e + lVar13 + 0x10);
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x136);
  lVar13 = 0;
  uStack_1208 = 0x60cdb2;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)&local_980;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [1] = (double)M;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)&local_980;
  memset(&local_500,0,0x480);
  alpha = &local_f40;
  local_f40 = (non_const_type)0x3ff0000000000000;
  uStack_1208 = 0x60cdd4;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
            (&local_500,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
              *)&local_e00,&local_980,(Scalar *)alpha);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[0];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[1] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[1];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[2] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[2];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[3] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[3];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[4] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[4];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[5] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[5];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[6] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[6];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[7] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[7];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[8] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[8];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[9] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[9];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[10] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xb]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xb];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xc];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xd];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xe]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xe];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xf]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xf];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x10]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x11];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x12]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x12];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x13];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x14]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x14];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x15]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x15];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x16]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x16];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x17];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x18];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x19];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x20];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x21]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x21];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x22];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x23]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x23];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x24];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x25];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x26];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x27];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x28]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x28];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x29]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x29];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x30];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x31];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x32];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x33];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x34];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x35]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x35];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x36]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x36];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x37]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x37];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x38];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x39]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x39];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x40];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x41];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x42]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x42];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x43];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x44]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x44];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x45]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x45];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x46]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x46];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x47];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x48];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x49]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x49];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x50]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x50];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x51]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x51];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x52]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x52];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x53]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x53];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x54];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x55];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x56];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x57]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x57];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x58]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x58];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x59];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x60];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x61];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x62];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[99] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[99];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[100];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x65];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x66];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x67];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x68];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x69]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x69];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x70]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x70];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x71]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x71];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x72];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x73];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x74];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x75];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x76]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x76];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x77]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x77];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x78];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x79];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x80];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x81];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x82];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x83]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x83];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x84];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x85];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x86]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x86];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x87];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x88];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x89];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8f];
  dStack_e40 = 0.0;
  dStack_e38 = 0.0;
  dStack_e30 = 0.0;
  dStack_e28 = 0.0;
  local_e80 = 0.0;
  dStack_e78 = 0.0;
  local_e70 = 0.0;
  dStack_e68 = 0.0;
  dStack_e60 = 0.0;
  dStack_e58 = 0.0;
  dStack_e50 = 0.0;
  dStack_e48 = 0.0;
  dStack_ec0 = 0.0;
  dStack_eb8 = 0.0;
  dStack_eb0 = 0.0;
  dStack_ea8 = 0.0;
  dStack_ea0 = 0.0;
  dStack_e98 = 0.0;
  dStack_e90 = 0.0;
  dStack_e88 = 0.0;
  local_f00 = 0.0;
  dStack_ef0 = 0.0;
  dStack_ee8 = 0.0;
  dStack_ee0 = 0.0;
  dStack_ed8 = 0.0;
  dStack_ed0 = 0.0;
  local_f40 = (non_const_type)0x0;
  pMStack_f38 = (RhsNested)0x0;
  dStack_f30 = 0.0;
  dStack_f28 = 0.0;
  dStack_f10 = 0.0;
  dStack_f08 = 0.0;
  do {
    *alpha = (non_const_type)0x3ff0000000000000;
    lVar13 = lVar13 + 0x30;
    alpha = alpha + 7;
  } while (lVar13 != 0x120);
  dStack_f20 = local_1120;
  auVar24._0_4_ = (uint)local_1100 ^ (uint)local_11d0;
  auVar24._4_4_ = local_1100._4_4_ ^ local_11d0._4_4_;
  auVar24._8_4_ = (uint)uStack_10f8 ^ (uint)uStack_11c8;
  auVar24._12_4_ = uStack_10f8._4_4_ ^ uStack_11c8._4_4_;
  dStack_f18 = (double)vmovlps_avx(auVar24);
  auVar25._0_4_ = (uint)local_1120 ^ (uint)local_11d0;
  auVar25._4_4_ = local_1120._4_4_ ^ local_11d0._4_4_;
  auVar25._8_4_ = (uint)uStack_1118 ^ (uint)uStack_11c8;
  auVar25._12_4_ = uStack_1118._4_4_ ^ uStack_11c8._4_4_;
  dStack_ef8 = (double)vmovlps_avx(auVar25);
  dStack_ec8 = local_1100;
  _local_1080 = ZEXT464(0) << 0x20;
  puVar12 = (undefined8 *)local_1080;
  dStack_f80 = 0.0;
  dStack_f78 = 0.0;
  dStack_f70 = 0.0;
  dStack_f68 = 0.0;
  local_fc0 = 0.0;
  dStack_fb8 = 0.0;
  local_fb0 = 0.0;
  dStack_fa8 = 0.0;
  lVar13 = 0;
  _auStack_1040 = _local_1080;
  _local_1000 = _local_1080;
  local_fa0 = dStack_f80;
  dStack_f98 = dStack_f78;
  dStack_f90 = dStack_f70;
  dStack_f88 = dStack_f68;
  do {
    *puVar12 = 0x3ff0000000000000;
    auVar28 = _local_1080;
    lVar13 = lVar13 + 0x30;
    puVar12 = puVar12 + 7;
  } while (lVar13 != 0x120);
  uStack_1060._0_4_ = (uint)local_1110;
  uStack_1060._4_4_ = local_1110._4_4_;
  auVar26._0_4_ = (uint)local_10f0 ^ (uint)local_11d0;
  auVar26._4_4_ = local_10f0._4_4_ ^ local_11d0._4_4_;
  auVar26._8_4_ = (uint)uStack_10e8 ^ (uint)uStack_11c8;
  auVar26._12_4_ = uStack_10e8._4_4_ ^ uStack_11c8._4_4_;
  dStack_1058 = (double)vmovlps_avx(auVar26);
  _dStack_1050 = auVar28._48_16_;
  auVar27._0_4_ = (uint)local_1110 ^ (uint)local_11d0;
  auVar27._4_4_ = local_1110._4_4_ ^ local_11d0._4_4_;
  auVar27._8_4_ = (uint)uStack_1108 ^ (uint)uStack_11c8;
  auVar27._12_4_ = uStack_1108._4_4_ ^ uStack_11c8._4_4_;
  uVar4 = vmovlps_avx(auVar27);
  auStack_1040._8_8_ = uVar4;
  uStack_1008._0_4_ = (uint)local_10f0;
  uStack_1008._4_4_ = local_10f0._4_4_;
  uStack_1208 = 0x60cff5;
  memset(&local_e00,0,0x480);
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_f40;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [1] = (double)pMStack_f38;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = dStack_f30;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = dStack_f28;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = dStack_f20;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = dStack_f18;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xc] = dStack_f10;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xd] = dStack_f08;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xe] = local_f00;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0xf] = dStack_ef8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x10] = dStack_ef0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x11] = dStack_ee8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x18] = dStack_ee0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x19] = dStack_ed8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1a] = dStack_ed0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1b] = dStack_ec8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1c] = dStack_ec0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x1d] = dStack_eb8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x24] = dStack_eb0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x25] = dStack_ea8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x26] = dStack_ea0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x27] = dStack_e98;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x28] = dStack_e90;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x29] = dStack_e88;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x30] = local_e80;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x31] = dStack_e78;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x32] = local_e70;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x33] = dStack_e68;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x34] = dStack_e60;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x35] = dStack_e58;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3c] = dStack_e50;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3d] = dStack_e48;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3e] = dStack_e40;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x3f] = dStack_e38;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x40] = dStack_e30;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x41] = dStack_e28;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x4e] = (double)local_1080._0_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x4f] = (double)local_1080._8_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x50] = dStack_1070;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x51] = dStack_1068;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x52] = uStack_1060;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x53] = dStack_1058;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5a] = dStack_1050;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5b] = dStack_1048;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5c] = (double)auStack_1040._0_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5d] = (double)auStack_1040._8_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5e] = dStack_1030;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x5f] = dStack_1028;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x66] = dStack_1020;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x67] = dStack_1018;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x68] = dStack_1010;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x69] = uStack_1008;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x6a] = (double)local_1000._0_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x6b] = (double)local_1000._8_8_;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x72] = dStack_ff0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x73] = dStack_fe8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x74] = dStack_fe0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x75] = dStack_fd8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x76] = dStack_fd0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x77] = dStack_fc8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x7e] = local_fc0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x7f] = dStack_fb8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x80] = local_fb0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x81] = dStack_fa8;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x82] = local_fa0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x83] = dStack_f98;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8a] = dStack_f90;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8b] = dStack_f88;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8c] = dStack_f80;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8d] = dStack_f78;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8e] = dStack_f70;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0x8f] = dStack_f68;
  uStack_1208 = 0x60d21d;
  local_e18.m_lhs.m_matrix = &local_e00;
  local_e18.m_rhs = M;
  local_e08 = &local_e00;
  memset(&local_500,0,0x480);
  local_1088 = 1.0;
  uStack_1208 = 0x60d236;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>(&local_500,&local_e18,&local_e00,&local_1088)
  ;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[0];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[1] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[1];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[2] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[2];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[3] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[3];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[4] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[4];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[5] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[5];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[6] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[6];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[7] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[7];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[8] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[8];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[9] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[9];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[10] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xb]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xb];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xc];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xd];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xe]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xe];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xf]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xf];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x10]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x11];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x12]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x12];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x13];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x14]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x14];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x15]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x15];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x16]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x16];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x17];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x18];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x19];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x20];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x21]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x21];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x22];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x23]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x23];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x24];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x25];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x26];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x27];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x28]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x28];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x29]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x29];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x30];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x31];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x32];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x33];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x34];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x35]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x35];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x36]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x36];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x37]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x37];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x38];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x39]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x39];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x40];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x41];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x42]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x42];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x43];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x44]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x44];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x45]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x45];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x46]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x46];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x47];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x48];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x49]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x49];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x50]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x50];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x51]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x51];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x52]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x52];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x53]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x53];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x54];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x55];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x56];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x57]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x57];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x58]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x58];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x59];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x60];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x61];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x62];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[99] =
       local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[99];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[100];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x65];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x66];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x67];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x68];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x69]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x69];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x70]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x70];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x71]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x71];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x72];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x73];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x74];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x75];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x76]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x76];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x77]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x77];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x78];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x79];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x80];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x81];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x82];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x83]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x83];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x84];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x85];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x86]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x86];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x87];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x88];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x89];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = local_500.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8f];
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix(
    ChMatrixNM<double, 12, 12>& M) {
    M.setZero();
    double mu1 = this->sectionA->GetMassPerUnitLength();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmzz1;
    double Jmyy1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    double Jmxx1 = Jmyy1 + Jmzz1;

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmzz2;
    double Jmyy2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    double Jmxx2 = Jmyy2 + Jmzz2;

    double L = this->GetLength();
    double LL = L * L;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;
    double mu = this->avg_sec_par->mu;
    double Jmxx = this->avg_sec_par->Jmxx;

    // The radii of gyration ry,rz are:
    // double ry = pow(Iyy / A, 0.5);
    // double rz = pow(Izz / A, 0.5);
    // We have: Iyy / A == Iyy * pho / (A * pho) = Jyy / mu
    // For wind turbine blade, the above equations are not true, but can be a good approximation.
    // double ry = pow(Jmyy / mu, 0.5);   // wrong modal results, error up to 5%
    // double rz = pow(Jmzz / mu, 0.5);   // wrong modal results, error up to 5%

    // double ry = pow(EImyy / EA, 0.5);  // run error
    // double rz = pow(EImzz / EA, 0.5);  // run error

    // Note: bending inertia has to be switched off!
    double ry = 0;  // Only this setting could give correct modal results
    double rz = 0;  // But, why? TODO: need an explanation

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double ry_L2 = pow(ry / L, 2.0);
    double rz_L2 = pow(rz / L, 2.0);
    double oneplusphiy2 = pow(1 + phiy, 2.0);
    double oneplusphiz2 = pow(1 + phiz, 2.0);
    double mAz = (13. / 35. + 7. / 10. * phiy + 1. / 3. * phiy2 + 6. / 5. * rz_L2) / oneplusphiy2;
    double mAy = (13. / 35. + 7. / 10. * phiz + 1. / 3. * phiz2 + 6. / 5. * ry_L2) / oneplusphiz2;
    double mBy = (9. / 70. + 3. / 10. * phiy + 1. / 6. * phiy2 - 6. / 5. * rz_L2) / oneplusphiy2;
    double mBz = (9. / 70. + 3. / 10. * phiz + 1. / 6. * phiz2 - 6. / 5. * ry_L2) / oneplusphiz2;
    double mCy =
        (11. / 210. + 11. / 120. * phiy + 1. / 24. * phiy2 + (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mCz =
        (11. / 210. + 11. / 120. * phiz + 1. / 24. * phiz2 + (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mDy =
        (13. / 420. + 3. / 40. * phiy + 1. / 24. * phiy2 - (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mDz =
        (13. / 420. + 3. / 40. * phiz + 1. / 24. * phiz2 - (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mEy =
        (1. / 105. + 1. / 60. * phiy + 1. / 120. * phiy2 + (2. / 15. + 1. / 6. * phiy + 1. / 3. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mEz =
        (1. / 105. + 1. / 60. * phiz + 1. / 120. * phiz2 + (2. / 15. + 1. / 6. * phiz + 1. / 3. * phiz2) * ry_L2) * LL /
        oneplusphiz2;
    double mFy =
        (1. / 140. + 1. / 60. * phiy + 1. / 120. * phiy2 + (1. / 30. + 1. / 6. * phiy - 1. / 6. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mFz =
        (1. / 140. + 1. / 60. * phiz + 1. / 120. * phiz2 + (1. / 30. + 1. / 6. * phiz - 1. / 6. * phiz2) * ry_L2) * LL /
        oneplusphiz2;

    double mt1 = mu1 * L;
    double mt2 = mu2 * L;
    double mt = mu * L;

    M(0, 0) = mt1 / 3.0;
    M(6, 6) = mt2 / 3.0;
    M(6, 0) = mt / 6.0;
    M(0, 6) = M(6, 0);

    M(3, 3) = Jmxx1 * L / 3.0;
    M(9, 9) = Jmxx2 * L / 3.0;
    M(9, 3) = Jmxx * L / 6.0;
    M(3, 9) = M(9, 3);

    M(1, 1) = mt1 * mAz;
    M(2, 2) = mt1 * mAy;
    M(4, 4) = mt1 * mEy;
    M(5, 5) = mt1 * mEz;
    M(7, 7) = mt2 * mAz;
    M(8, 8) = mt2 * mAy;
    M(10, 10) = mt2 * mEy;
    M(11, 11) = mt2 * mEz;

    M(4, 2) = -mt1 * mCy;
    M(5, 1) = mt1 * mCz;
    M(7, 1) = mt * mBz;
    M(8, 2) = mt * mBy;
    M(7, 5) = mt * mDz;
    M(8, 4) = -mt * mDy;
    M(10, 2) = mt * mDy;
    M(11, 1) = -mt * mDz;
    M(10, 4) = -mt * mFy;
    M(11, 5) = -mt * mFz;
    M(10, 8) = mt2 * mCy;
    M(11, 7) = -mt2 * mCz;

    M(2, 4) = M(4, 2);
    M(1, 5) = M(5, 1);
    M(1, 7) = M(7, 1);
    M(2, 8) = M(8, 2);
    M(5, 7) = M(7, 5);
    M(4, 8) = M(8, 4);
    M(2, 10) = M(10, 2);
    M(1, 11) = M(11, 1);
    M(4, 10) = M(10, 4);
    M(5, 11) = M(11, 5);
    M(8, 10) = M(10, 8);
    M(7, 11) = M(11, 7);

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(mass_phi1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(mass_phi2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;
    M = Rotsect.transpose() * M * Rotsect;

    // transformation matrix for section A
    ChMatrixNM<double, 6, 6> Tm1;
    Tm1.setIdentity();
    Tm1(0, 4) = Mz1;
    Tm1(0, 5) = -My1;
    Tm1(1, 3) = -Mz1;
    Tm1(2, 3) = My1;

    // transformation matrix for section B
    ChMatrixNM<double, 6, 6> Tm2;
    Tm2.setIdentity();
    Tm2(0, 4) = Mz2;
    Tm2(0, 5) = -My2;
    Tm2(1, 3) = -Mz2;
    Tm2(2, 3) = My2;

    // whole transformation matrix
    ChMatrixNM<double, 12, 12> Tm;
    Tm.setZero();
    Tm.block<6, 6>(0, 0) = Tm1;
    Tm.block<6, 6>(6, 6) = Tm2;

    // do the transformation for mass matrix
    M = Tm.transpose() * M * Tm;
}